

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddCustomCommandToTarget
          (cmMakefile *this,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,CustomCommandType type,char *comment,
          char *workingDir,bool escapeOldStyle,bool uses_terminal,string *depfile,
          bool command_expand_lists,ObjectLibraryCommands objLibraryCommands)

{
  pointer *ppbVar1;
  bool bVar2;
  PolicyStatus PVar3;
  iterator iVar4;
  ostream *poVar5;
  cmSourceFile *this_00;
  cmTarget *pcVar6;
  PolicyID id;
  long lVar7;
  MessageType t;
  char *pcVar8;
  pointer sourceName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_output;
  cmCustomCommand cc;
  
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Targets)._M_h,target);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur != (__node_type *)0x0) {
    if ((objLibraryCommands == RejectObjectLibraryCommands) &&
       (*(int *)((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                       ._M_cur + 0x238) == 4)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cc,"Target \"",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&cc,(target->_M_dataplus)._M_p,target->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "\" is an OBJECT library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                 ,0x55);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,(string *)&no_output);
      if (no_output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&no_output.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(no_output.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((no_output.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
    }
    else {
      if (*(int *)((long)iVar4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                         ._M_cur + 0x238) != 7) {
        sourceName = (byproducts->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        if (sourceName !=
            (byproducts->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          ppbVar1 = &cc.Outputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          do {
            this_00 = GetOrCreateSource(this,sourceName,true);
            if (this_00 != (cmSourceFile *)0x0) {
              cc.Outputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&cc,"GENERATED","");
              cmSourceFile::SetProperty(this_00,(string *)&cc,"1");
              if (cc.Outputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
                operator_delete(cc.Outputs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((cc.Outputs.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
            }
            sourceName = sourceName + 1;
          } while (sourceName !=
                   (byproducts->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        }
        no_output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        no_output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        no_output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmCustomCommand::cmCustomCommand
                  (&cc,this,&no_output,byproducts,depends,commandLines,comment,workingDir);
        cmCustomCommand::SetEscapeOldStyle(&cc,escapeOldStyle);
        cmCustomCommand::SetEscapeAllowMakeVars(&cc,true);
        cmCustomCommand::SetUsesTerminal(&cc,uses_terminal);
        cmCustomCommand::SetCommandExpandLists(&cc,command_expand_lists);
        cmCustomCommand::SetDepfile(&cc,depfile);
        if (type < (POST_BUILD|PRE_LINK)) {
          std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::push_back
                    ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)
                     ((long)iVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                            ._M_cur + (ulong)(type * 0x18) + 0x1b0),&cc);
        }
        cmCustomCommand::~cmCustomCommand(&cc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&no_output);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cc,"Target \"",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&cc,(target->_M_dataplus)._M_p,target->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "\" is an INTERFACE library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                 ,0x58);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,(string *)&no_output);
      if (no_output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&no_output.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(no_output.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((no_output.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
    }
    goto LAB_0035f9ee;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cc);
  PVar3 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0040);
  if (PVar3 - NEW < 3) {
    t = FATAL_ERROR;
LAB_0035f71c:
    bVar2 = true;
  }
  else {
    t = AUTHOR_WARNING;
    if (PVar3 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&no_output,(cmPolicies *)0x28,id);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&cc,
                          (char *)no_output.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                          (long)no_output.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      t = AUTHOR_WARNING;
      if (no_output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&no_output.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(no_output.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((no_output.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      goto LAB_0035f71c;
    }
    bVar2 = false;
  }
  if (bVar2) {
    pcVar6 = FindTargetToUse(this,target,false);
    if (pcVar6 == (cmTarget *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cc,"No TARGET \'",0xb);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&cc,(target->_M_dataplus)._M_p,target->_M_string_length);
      lVar7 = 0x25;
      pcVar8 = "\' has been created in this directory.";
    }
    else if (pcVar6->IsImportedTarget == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cc,"TARGET \'",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&cc,(target->_M_dataplus)._M_p,target->_M_string_length);
      lVar7 = 0x26;
      pcVar8 = "\' is IMPORTED and does not build here.";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&cc,"TARGET \'",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&cc,(target->_M_dataplus)._M_p,target->_M_string_length);
      lVar7 = 0x24;
      pcVar8 = "\' was not created in this directory.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
    std::__cxx11::stringbuf::str();
    IssueMessage(this,t,(string *)&no_output);
    if (no_output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&no_output.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(no_output.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((no_output.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
  }
LAB_0035f9ee:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cc);
  std::ios_base::~ios_base((ios_base *)&cc.Backtrace.Bottom.Position.Position);
  return;
}

Assistant:

void cmMakefile::AddCustomCommandToTarget(
  const std::string& target, const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends,
  const cmCustomCommandLines& commandLines, cmTarget::CustomCommandType type,
  const char* comment, const char* workingDir, bool escapeOldStyle,
  bool uses_terminal, const std::string& depfile, bool command_expand_lists,
  ObjectLibraryCommands objLibraryCommands)
{
  // Find the target to which to add the custom command.
  cmTargets::iterator ti = this->Targets.find(target);

  if (ti == this->Targets.end()) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (this->GetPolicyStatus(cmPolicies::CMP0040)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0040) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }

    if (issueMessage) {
      if (cmTarget const* t = this->FindTargetToUse(target)) {
        if (t->IsImported()) {
          e << "TARGET '" << target
            << "' is IMPORTED and does not build here.";
        } else {
          e << "TARGET '" << target << "' was not created in this directory.";
        }
      } else {
        e << "No TARGET '" << target
          << "' has been created in this directory.";
      }
      IssueMessage(messageType, e.str());
    }

    return;
  }

  if (objLibraryCommands == RejectObjectLibraryCommands &&
      ti->second.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an OBJECT library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (ti->second.GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an INTERFACE library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  // Always create the byproduct sources and mark them generated.
  for (std::vector<std::string>::const_iterator o = byproducts.begin();
       o != byproducts.end(); ++o) {
    if (cmSourceFile* out = this->GetOrCreateSource(*o, true)) {
      out->SetProperty("GENERATED", "1");
    }
  }

  // Add the command to the appropriate build step for the target.
  std::vector<std::string> no_output;
  cmCustomCommand cc(this, no_output, byproducts, depends, commandLines,
                     comment, workingDir);
  cc.SetEscapeOldStyle(escapeOldStyle);
  cc.SetEscapeAllowMakeVars(true);
  cc.SetUsesTerminal(uses_terminal);
  cc.SetCommandExpandLists(command_expand_lists);
  cc.SetDepfile(depfile);
  switch (type) {
    case cmTarget::PRE_BUILD:
      ti->second.AddPreBuildCommand(cc);
      break;
    case cmTarget::PRE_LINK:
      ti->second.AddPreLinkCommand(cc);
      break;
    case cmTarget::POST_BUILD:
      ti->second.AddPostBuildCommand(cc);
      break;
  }
}